

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_callstack.c
# Opt level: O1

void ht_feature_callstack_stop(HT_Timeline *timeline)

{
  HT_FeatureKlass *pHVar1;
  long lVar2;
  HT_ThreadId HVar3;
  HT_Feature *pHVar4;
  HT_TimestampNs HVar5;
  
  pHVar4 = ht_timeline_get_feature
                     (timeline,(HT_FeatureKlass *)HT_FeatureCallstack_get_class_feature_klass);
  pHVar1 = pHVar4[5].klass;
  lVar2 = *(long *)((long)pHVar4[4].klass + (long)pHVar4[3].klass * 8 + -8);
  HVar5 = ht_monotonic_clock_get_timestamp();
  *(HT_TimestampNs *)((long)&pHVar1[1].id + lVar2) = HVar5 - *(long *)((long)&pHVar1->id + lVar2);
  HVar3 = ht_thread_get_current_thread_id();
  *(HT_ThreadId *)((long)&pHVar1[2].destroy + lVar2) = HVar3;
  ht_timeline_push_event(timeline,(HT_Event *)((long)&pHVar1->destroy + lVar2));
  ht_stack_pop((HT_Stack *)(pHVar4 + 1));
  return;
}

Assistant:

void
ht_feature_callstack_stop(HT_Timeline* timeline)
{
    HT_FeatureCallstack* f = HT_FeatureCallstack_from_timeline(timeline);
    HT_CallstackBaseEvent* event = (HT_CallstackBaseEvent*)ht_stack_top(&f->stack);

    event->duration = ht_monotonic_clock_get_timestamp() - HT_EVENT(event)->timestamp;
    event->thread_id = ht_thread_get_current_thread_id();

    ht_timeline_push_event((HT_Timeline*)timeline, HT_EVENT(event));

    ht_stack_pop(&f->stack);
}